

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O3

void P_MarkWorldVarStrings(void)

{
  byte *pbVar1;
  PoolEntry *pPVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  
  uVar3 = GlobalACSStrings.Pool.Count;
  pPVar2 = GlobalACSStrings.Pool.Array;
  lVar4 = 0;
  do {
    if (((*(uint *)((long)ACS_WorldVars + lVar4) & 0xfff00000) == 0x7ff00000) &&
       (uVar5 = *(uint *)((long)ACS_WorldVars + lVar4) & 0xfffff, uVar5 < uVar3)) {
      pbVar1 = (byte *)((long)&pPVar2[uVar5].LockCount + 3);
      *pbVar1 = *pbVar1 | 0x80;
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x400);
  lVar4 = 0;
  do {
    ACSStringPool::MarkStringMap
              (&GlobalACSStrings,(FWorldGlobalArray *)((long)&ACS_WorldArrays[0].Nodes + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x1800);
  return;
}

Assistant:

void P_MarkWorldVarStrings()
{
	GlobalACSStrings.MarkStringArray(ACS_WorldVars, countof(ACS_WorldVars));
	for (size_t i = 0; i < countof(ACS_WorldArrays); ++i)
	{
		GlobalACSStrings.MarkStringMap(ACS_WorldArrays[i]);
	}
}